

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters
          (NetworkUpdateParameters *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NetworkUpdateParameters_003c10b8
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->losslayers_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->losslayers_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->losslayers_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->losslayers_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->shuffle_ = (BoolParameter *)0x0;
  this->seed_ = (Int64Parameter *)0x0;
  this->optimizer_ = (Optimizer *)0x0;
  this->epochs_ = (Int64Parameter *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

NetworkUpdateParameters::NetworkUpdateParameters()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.NetworkUpdateParameters)
}